

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

transform<rangeless::tsv::split_on_delim> *
rangeless::fn::transform<rangeless::tsv::split_on_delim>
          (transform<rangeless::tsv::split_on_delim> *__return_storage_ptr__,split_on_delim *map_fn)

{
  split_on_delim *map_fn_local;
  
  tsv::split_on_delim::split_on_delim(&__return_storage_ptr__->map_fn,map_fn);
  return __return_storage_ptr__;
}

Assistant:

impl::transform<F> transform(F map_fn)
    {
        // Rationale:
        // <br>
        // 1) A possible implementation for a container-input could assume that 
        // `transform` function is inexpensive to recompute on-demand (this is
        // this approach in `range-v3` which may call `transform` multiple times
        // per element depending on the access pattern from the downstream views).
        // 
        // 2) An implementation could require the result-type to be cacheable
        // and assume it is 'light' in terms of memory requirements and memoize the results.
        //
        // Our approach of applying `transform` lazily allows us to
        // make neither assumption and apply `transform` at most once per element and without caching. 
        // The user-code may always follow that by fn::to_vector() when necessary.

        return { std::move(map_fn) };
    }